

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

MOJOSHADER_parseData *
MOJOSHADER_parse(char *profile,char *mainfn,uchar *tokenbuf,uint bufsize,MOJOSHADER_swizzle *swiz,
                uint swizcount,MOJOSHADER_samplerMap *smap,uint smapcount,MOJOSHADER_malloc m,
                MOJOSHADER_free f,void *d)

{
  SourceMod SVar1;
  MOJOSHADER_swizzle *pMVar2;
  uint32 *puVar3;
  uint *puVar4;
  code *pcVar5;
  RegisterList *pRVar6;
  bool bVar7;
  uint32 uVar8;
  Context *ctx;
  char *pcVar9;
  ulong uVar10;
  RegisterList *pRVar11;
  MOJOSHADER_parseData *pMVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  MOJOSHADER_shaderType MVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  SourceArgInfo *arg;
  
  if (((m == (MOJOSHADER_malloc)0x0 && f != (MOJOSHADER_free)0x0) ||
      (m != (MOJOSHADER_malloc)0x0 && f == (MOJOSHADER_free)0x0)) ||
     (ctx = build_context(profile,mainfn,tokenbuf,bufsize,swiz,swizcount,smap,smapcount,m,f,d),
     ctx == (Context *)0x0)) {
    return &MOJOSHADER_out_of_mem_data;
  }
  if (profile == (char *)0x0) {
    failf(ctx,"%s","Profile name is NULL");
  }
  if (ctx->isfail != 0) goto LAB_0010a30e;
  if ((ulong)ctx->swizzles_count != 0) {
    pMVar2 = ctx->swizzles;
    lVar15 = 0;
    do {
      if (((3 < pMVar2->swizzles[lVar15]) || (3 < pMVar2->swizzles[lVar15 + 1])) ||
         ((3 < pMVar2->swizzles[lVar15 + 2] || (3 < pMVar2->swizzles[lVar15 + 3])))) {
        failf(ctx,"%s","invalid swizzle");
        break;
      }
      lVar15 = lVar15 + 0xc;
    } while ((ulong)ctx->swizzles_count * 0xc != lVar15);
  }
  ctx->current_position = 0;
  if (ctx->tokencount == 0) {
    bVar7 = false;
    failf(ctx,"%s","Expected version token, got none at all.");
    uVar19 = 0;
  }
  else {
    uVar19 = *ctx->tokens;
    ctx->version_token = uVar19;
    if (uVar19 >> 0x10 == 0xffff) {
      pcVar9 = "ps";
      MVar17 = MOJOSHADER_TYPE_PIXEL;
    }
    else {
      if (uVar19 >> 0x10 != 0xfffe) {
        failf(ctx,"%s","Unsupported shader type or not a shader at all");
        uVar19 = 0xffffffff;
        bVar7 = true;
        goto LAB_00109c97;
      }
      pcVar9 = "vs";
      MVar17 = MOJOSHADER_TYPE_VERTEX;
    }
    ctx->shader_type = MVar17;
    ctx->shader_type_str = pcVar9;
    ctx->major_ver = (uint8)(uVar19 >> 8);
    ctx->minor_ver = (uint8)uVar19;
    uVar20 = 0;
    if ((uint8)uVar19 != 0xff) {
      uVar20 = uVar19 & 0xfe;
    }
    if (0x30001 < (uVar20 | (uVar19 >> 8 & 0xff) << 0x10)) {
      failf(ctx,"Shader Model %u.%u is currently unsupported.",(ulong)(uVar19 >> 8 & 0xff),
            (ulong)(uVar19 & 0xff));
    }
    uVar19 = 1;
    if (ctx->isfail == 0) {
      (*ctx->profile->start_emitter)(ctx,profile);
    }
    bVar7 = false;
  }
LAB_00109c97:
  if (ctx->mainfn == (char *)0x0) {
    pcVar9 = (char *)(*ctx->malloc)(5,ctx->malloc_data);
    if (pcVar9 == (char *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
    }
    else {
      builtin_strncpy(pcVar9,"main",5);
    }
    ctx->mainfn = pcVar9;
  }
  if (!bVar7) {
    if (ctx->tokencount < uVar19) {
      failf(ctx,"%s","Corrupted or truncated shader");
      ctx->tokencount = uVar19;
    }
    ctx->tokens = ctx->tokens + (int)uVar19;
    ctx->current_position = ctx->current_position + uVar19 * 4;
    bVar7 = false;
    puVar3 = &ctx->tokencount;
    *puVar3 = *puVar3 - uVar19;
    if (*puVar3 != 0) {
      bVar7 = false;
      do {
        if (ctx->know_shader_size == 0) {
          ctx->tokencount = 0xffffffff;
        }
        if (ctx->isfail != 0) {
          ctx->isfail = 0;
          bVar7 = true;
        }
        if (ctx->output_stack_len != 0) {
          __assert_fail("ctx->output_stack_len == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                        ,0x2b63,"int parse_token(Context *)");
        }
        if (ctx->tokencount == 0) {
          failf(ctx,"%s","unexpected end of shader.");
LAB_00109e25:
          failf(ctx,"unknown token (0x%x)",(ulong)*ctx->tokens);
          uVar20 = 1;
        }
        else {
          uVar19 = *ctx->tokens;
          uVar20 = 0;
          uVar18 = 0;
          if ((uVar19 & 0xffff) == 0xfffe) {
            if ((int)uVar19 < 0) {
              failf(ctx,"%s","comment token high bit must be zero.");
            }
            uVar18 = uVar19 >> 0x10;
          }
          if ((uVar19 & 0xffff) == 0xfffe) {
            if ((1 < uVar18) && (uVar18 < ctx->tokencount)) {
              puVar3 = ctx->tokens;
              if (puVar3[1] == 0x42415443) {
                parse_constant_table(ctx,puVar3,uVar18 * 4,ctx->version_token,1,&ctx->ctab);
              }
              else if (puVar3[1] == 0x53455250) {
                parse_preshader(ctx,puVar3 + 2,uVar18 - 2);
              }
            }
            uVar20 = uVar18 + 1;
          }
          if (uVar20 == 0) {
            if (*ctx->tokens == 0xffff) {
              if (ctx->know_shader_size == 0) {
                ctx->tokencount = 1;
              }
              else if (ctx->tokencount != 1) {
                failf(ctx,"%s","end token before end of stream");
              }
              uVar20 = 1;
              if (ctx->isfail == 0) {
                (*ctx->profile->end_emitter)(ctx);
              }
            }
            else {
              uVar8 = *ctx->tokens;
              uVar20 = 0;
              if (uVar8 == 0xfffd) {
                if (((ctx->shader_type != MOJOSHADER_TYPE_PIXEL) || (ctx->major_ver != '\x01')) ||
                   (ctx->minor_ver != '\x04')) {
                  failf(ctx,"%s","phase token only available in 1.4 pixel shaders");
                }
                uVar20 = 1;
                if (ctx->isfail == 0) {
                  (*ctx->profile->phase_emitter)(ctx);
                }
              }
              if (uVar8 != 0xfffd) {
                puVar4 = ctx->tokens;
                uVar19 = *puVar4;
                uVar18 = uVar19 & 0xffff;
                uVar10 = (ulong)uVar18;
                uVar20 = 0;
                if (uVar18 < 0x61) {
                  iVar16 = ctx->current_position;
                  uVar8 = ctx->tokencount;
                  pcVar5 = *(code **)(uVar10 * 0x48 + 0x149a80 + (long)ctx->profileid * 8);
                  if ((int)uVar19 < 0) {
                    failf(ctx,"%s","instruction token high bit must be zero.");
                  }
                  uVar21 = uVar19 >> 0x18 & 0xf;
                  pcVar9 = instructions[uVar10].opcode_string;
                  if (pcVar9 == (char *)0x0) {
                    failf(ctx,"%s","Unknown opcode.");
LAB_0010a264:
                    uVar20 = uVar21 + 1;
                  }
                  else {
                    ctx->coissue = (uVar19 & 0x40000000) >> 0x1e;
                    if ((uVar19 & 0x40000000) != 0) {
                      if (ctx->shader_type != MOJOSHADER_TYPE_PIXEL) {
                        failf(ctx,"%s","coissue instruction on non-pixel shader");
                      }
                      if (1 < ctx->major_ver) {
                        failf(ctx,"%s","coissue instruction in Shader Model >= 2.0");
                      }
                    }
                    if ((ctx->shader_type & instructions[uVar10].shader_types) ==
                        MOJOSHADER_TYPE_UNKNOWN) {
                      failf(ctx,"opcode \'%s\' not available in this shader type.",pcVar9);
                    }
                    ctx->dwords[0] = 0;
                    ctx->dwords[1] = 0;
                    ctx->dwords[2] = 0;
                    ctx->dwords[3] = 0;
                    ctx->instruction_controls = uVar19 >> 0x10 & 0xff;
                    ctx->predicated = (uVar19 & 0x10000000) >> 0x1c;
                    ctx->tokens = ctx->tokens + 1;
                    ctx->tokencount = ctx->tokencount - 1;
                    ctx->current_position = ctx->current_position + 4;
                    uVar20 = (*instructions[uVar10].parse_args)(ctx);
                    if ((uVar19 & 0x10000000) != 0) {
                      parse_source_token(ctx,&ctx->predicate_arg);
                      if ((ctx->predicate_arg).regtype != REG_TYPE_MAX) {
                        failf(ctx,"%s","Predicated instruction but not predicate register!");
                      }
                      SVar1 = (ctx->predicate_arg).src_mod;
                      if ((SVar1 != SRCMOD_NONE) && (SVar1 != SRCMOD_NOT)) {
                        failf(ctx,"%s","Predicated instruction register is not NONE or NOT");
                      }
                      uVar19 = (ctx->predicate_arg).swizzle;
                      if ((uVar19 != 0xe4) &&
                         (((uVar13 = uVar19 >> 2 & 3, (uVar19 & 3) != uVar13 ||
                           (uVar14 = uVar19 >> 4 & 3, uVar13 != uVar14)) ||
                          (uVar14 != (uVar19 >> 6 & 3))))) {
                        failf(ctx,"%s","Predicated instruction register has wrong swizzle");
                      }
                      if ((ctx->predicate_arg).relative != 0) {
                        failf(ctx,"%s","relative addressing in predicated token");
                      }
                      uVar20 = uVar20 + 1;
                    }
                    ctx->tokens = puVar4;
                    ctx->tokencount = uVar8;
                    ctx->current_position = iVar16;
                    if (instructions[uVar10].state != (state_function)0x0) {
                      (*instructions[uVar10].state)(ctx);
                    }
                    ctx->instruction_count = ctx->instruction_count + instructions[uVar10].slots;
                    if (ctx->isfail == 0) {
                      (*pcVar5)(ctx);
                    }
                    if (ctx->reset_texmpad != 0) {
                      ctx->texm3x2pad_dst0 = -1;
                      ctx->texm3x2pad_src0 = -1;
                      ctx->texm3x3pad_dst0 = -1;
                      ctx->texm3x3pad_src0 = -1;
                      ctx->texm3x3pad_dst1 = -1;
                      ctx->texm3x3pad_src1 = -1;
                      ctx->reset_texmpad = 0;
                    }
                    ctx->previous_opcode = uVar18;
                    ctx->scratch_registers = 0;
                    if (ctx->major_ver < 2) {
                      if (uVar21 != 0) {
                        failf(ctx,"%s","instruction token count must be zero");
                      }
                    }
                    else if (uVar20 != uVar21 + 1) {
                      failf(ctx,"wrong token count (%u, not %u) for opcode \'%s\'.",(ulong)uVar20,
                            (ulong)(uVar21 + 1),pcVar9);
                      goto LAB_0010a264;
                    }
                  }
                }
                if (uVar20 == 0) goto LAB_00109e25;
              }
            }
          }
        }
        if (ctx->tokencount < uVar20) {
          failf(ctx,"%s","Corrupted or truncated shader");
          break;
        }
        ctx->tokens = ctx->tokens + (int)uVar20;
        ctx->current_position = ctx->current_position + uVar20 * 4;
        uVar8 = ctx->tokencount - uVar20;
        ctx->tokencount = uVar8;
      } while (uVar8 != 0);
    }
    ctx->current_position = -1;
    if ((ctx->shader_type == MOJOSHADER_TYPE_PIXEL) && (ctx->major_ver < 2)) {
      pRVar6 = (ctx->used_registers).next;
      if (pRVar6 == (RegisterList *)0x0) {
        pRVar11 = (RegisterList *)0x0;
      }
      else {
        pRVar11 = (RegisterList *)0x0;
        if ((pRVar6->regtype & 0xffff) == REG_TYPE_TEMP && pRVar6->regnum == 0) {
          pRVar11 = pRVar6;
        }
      }
      if ((pRVar11 == (RegisterList *)0x0) || (pRVar11->written == 0)) {
        failf(ctx,"%s","r0 (pixel shader 1.x color output) never written to");
      }
    }
    iVar16 = 1;
    if (!bVar7) {
      process_definitions(ctx);
      iVar16 = ctx->isfail;
    }
    if (iVar16 == 0) {
      (*ctx->profile->finalize_emitter)(ctx);
    }
    ctx->isfail = iVar16;
  }
LAB_0010a30e:
  pMVar12 = build_parsedata(ctx);
  destroy_context(ctx);
  return pMVar12;
}

Assistant:

const MOJOSHADER_parseData *MOJOSHADER_parse(const char *profile,
                                             const char *mainfn,
                                             const unsigned char *tokenbuf,
                                             const unsigned int bufsize,
                                             const MOJOSHADER_swizzle *swiz,
                                             const unsigned int swizcount,
                                             const MOJOSHADER_samplerMap *smap,
                                             const unsigned int smapcount,
                                             MOJOSHADER_malloc m,
                                             MOJOSHADER_free f, void *d)
{
    MOJOSHADER_parseData *retval = NULL;
    Context *ctx = NULL;
    int rc = 0;
    int failed = 0;

    if ( ((m == NULL) && (f != NULL)) || ((m != NULL) && (f == NULL)) )
        return &MOJOSHADER_out_of_mem_data;  // supply both or neither.

    ctx = build_context(profile, mainfn, tokenbuf, bufsize, swiz, swizcount,
                        smap, smapcount, m, f, d);
    if (ctx == NULL)
        return &MOJOSHADER_out_of_mem_data;

    if (profile == NULL)  // build_context allows NULL; check this ourselves.
        fail(ctx, "Profile name is NULL");

    if (isfail(ctx))
    {
        retval = build_parsedata(ctx);
        destroy_context(ctx);
        return retval;
    } // if

    verify_swizzles(ctx);

    // Version token always comes first.
    ctx->current_position = 0;
    rc = parse_version_token(ctx, profile);

    if (!ctx->mainfn)
        ctx->mainfn = StrDup(ctx, "main");

    // drop out now if this definitely isn't bytecode. Saves lots of
    //  meaningless errors flooding through.
    if (rc < 0)
    {
        retval = build_parsedata(ctx);
        destroy_context(ctx);
        return retval;
    } // if

    if ( ((uint32) rc) > ctx->tokencount )
    {
        fail(ctx, "Corrupted or truncated shader");
        ctx->tokencount = rc;
    } // if

    adjust_token_position(ctx, rc);

    // parse out the rest of the tokens after the version token...
    while (ctx->tokencount > 0)
    {
        if (!ctx->know_shader_size)
            ctx->tokencount = 0xFFFFFFFF;  // keep this value obscenely large.

        // reset for each token.
        if (isfail(ctx))
        {
            failed = 1;
            ctx->isfail = 0;
        } // if

        rc = parse_token(ctx);
        if ( ((uint32) rc) > ctx->tokencount )
        {
            fail(ctx, "Corrupted or truncated shader");
            break;
        } // if

        adjust_token_position(ctx, rc);
    } // while

    ctx->current_position = MOJOSHADER_POSITION_AFTER;

    // for ps_1_*, the output color is written to r0...throw an
    //  error if this register was never written. This isn't
    //  important for vertex shaders, or shader model 2+.
    if (shader_is_pixel(ctx) && !shader_version_atleast(ctx, 2, 0))
    {
        if (!register_was_written(ctx, REG_TYPE_TEMP, 0))
            fail(ctx, "r0 (pixel shader 1.x color output) never written to");
    } // if

    if (!failed)
    {
        process_definitions(ctx);
        failed = isfail(ctx);
    } // if

    if (!failed)
        ctx->profile->finalize_emitter(ctx);

    ctx->isfail = failed;
    retval = build_parsedata(ctx);
    destroy_context(ctx);
    return retval;
}